

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra.c
# Opt level: O3

Gia_ManEra_t * Gia_ManEraCreate(Gia_Man_t *pAig)

{
  undefined4 uVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  Gia_ManEra_t *pGVar7;
  uint *__s;
  Mem_Fixed_t *pMVar8;
  Vec_Ptr_t *pVVar9;
  void **ppvVar10;
  uint *puVar11;
  undefined8 *__ptr;
  void *pvVar12;
  Vec_Int_t *pVVar13;
  int *piVar14;
  byte bVar15;
  uint uVar16;
  undefined8 *puVar17;
  long lVar18;
  ulong uVar19;
  int iVar20;
  ulong uVar21;
  int iVar22;
  ulong uVar23;
  uint uVar24;
  long lVar25;
  int iVar26;
  int iVar28;
  undefined1 auVar27 [16];
  undefined1 auVar29 [16];
  undefined1 auVar31 [16];
  int iVar33;
  undefined1 auVar32 [16];
  long lVar30;
  
  pGVar7 = (Gia_ManEra_t *)calloc(1,0x58);
  pGVar7->pAig = pAig;
  uVar16 = pAig->nRegs;
  iVar20 = pAig->vCis->nSize - uVar16;
  bVar15 = (char)iVar20 - 5;
  iVar22 = 1 << (bVar15 & 0x1f);
  iVar26 = (((int)uVar16 >> 5) + 1) - (uint)((uVar16 & 0x1f) == 0);
  if (iVar20 < 6) {
    iVar22 = 1;
  }
  pGVar7->nWordsSim = iVar22;
  pGVar7->nWordsDat = iVar26;
  if (iVar20 < 6) {
    bVar15 = 0;
  }
  __s = (uint *)malloc((long)(pAig->nObjs << (bVar15 & 0x1f)) << 2);
  pGVar7->pDataSim = __s;
  pMVar8 = Mem_FixedStart(iVar26 * 4 + 0x10);
  pGVar7->pMemory = pMVar8;
  pVVar9 = (Vec_Ptr_t *)malloc(0x10);
  pVVar9->nCap = 100000;
  ppvVar10 = (void **)malloc(800000);
  pVVar9->pArray = ppvVar10;
  pGVar7->vStates = pVVar9;
  uVar16 = 99999;
  while( true ) {
    do {
      uVar24 = uVar16 + 1;
      uVar6 = uVar16 & 1;
      uVar16 = uVar24;
    } while (uVar6 != 0);
    if (uVar24 < 9) break;
    iVar20 = 5;
    while (uVar24 % (iVar20 - 2U) != 0) {
      uVar6 = iVar20 * iVar20;
      iVar20 = iVar20 + 2;
      if (uVar24 < uVar6) goto LAB_00731c16;
    }
  }
LAB_00731c16:
  pGVar7->nBins = uVar24;
  puVar11 = (uint *)calloc((long)(int)uVar24,4);
  pGVar7->pBins = puVar11;
  pVVar9->nSize = 1;
  *ppvVar10 = (void *)0x0;
  uVar23 = (long)pAig->vCis->nSize - (long)pAig->nRegs;
  iVar20 = (int)uVar23;
  uVar16 = 1 << ((char)uVar23 - 5U & 0x1f);
  if (iVar20 < 6) {
    uVar16 = 1;
  }
  __ptr = (undefined8 *)malloc(((long)(int)uVar16 * 4 + 8) * uVar23);
  if (iVar20 < 1) {
LAB_00731f31:
    if (__ptr == (undefined8 *)0x0) goto LAB_00731f3e;
  }
  else {
    pvVar12 = __ptr + uVar23;
    uVar23 = uVar23 & 0xffffffff;
    puVar17 = __ptr;
    uVar21 = uVar23;
    do {
      *puVar17 = pvVar12;
      auVar5 = _DAT_0093e4e0;
      auVar4 = _DAT_0093d220;
      auVar3 = _DAT_0093d210;
      puVar17 = puVar17 + 1;
      pvVar12 = (void *)((long)pvVar12 + (long)(int)uVar16 * 4);
      uVar21 = uVar21 - 1;
    } while (uVar21 != 0);
    lVar18 = (ulong)uVar16 - 1;
    auVar27._8_4_ = (int)lVar18;
    auVar27._0_8_ = lVar18;
    auVar27._12_4_ = (int)((ulong)lVar18 >> 0x20);
    uVar21 = 0;
    auVar27 = auVar27 ^ _DAT_0093d220;
    do {
      lVar18 = __ptr[uVar21];
      iVar26 = auVar27._0_4_;
      iVar28 = auVar27._4_4_;
      if (uVar21 < 5) {
        if (0 < (int)uVar16) {
          uVar1 = (&DAT_00a331f0)[uVar21];
          lVar25 = 0;
          auVar29 = auVar3;
          auVar31 = auVar5;
          do {
            auVar32 = auVar29 ^ auVar4;
            if ((bool)(~(auVar32._4_4_ == iVar28 && iVar26 < auVar32._0_4_ || iVar28 < auVar32._4_4_
                        ) & 1)) {
              *(undefined4 *)(lVar18 + lVar25) = uVar1;
            }
            if ((auVar32._12_4_ != auVar27._12_4_ || auVar32._8_4_ <= auVar27._8_4_) &&
                auVar32._12_4_ <= auVar27._12_4_) {
              *(undefined4 *)(lVar18 + 4 + lVar25) = uVar1;
            }
            iVar33 = SUB164(auVar31 ^ auVar4,4);
            if (iVar33 <= iVar28 && (iVar33 != iVar28 || SUB164(auVar31 ^ auVar4,0) <= iVar26)) {
              *(undefined4 *)(lVar18 + 8 + lVar25) = uVar1;
              *(undefined4 *)(lVar18 + 0xc + lVar25) = uVar1;
            }
            lVar30 = auVar29._8_8_;
            auVar29._0_8_ = auVar29._0_8_ + 4;
            auVar29._8_8_ = lVar30 + 4;
            lVar30 = auVar31._8_8_;
            auVar31._0_8_ = auVar31._0_8_ + 4;
            auVar31._8_8_ = lVar30 + 4;
            lVar25 = lVar25 + 0x10;
          } while ((ulong)(uVar16 + 3 >> 2) << 4 != lVar25);
        }
      }
      else if (0 < (int)uVar16) {
        uVar24 = 1 << ((char)uVar21 - 5U & 0x1f);
        uVar19 = 0;
        auVar32 = auVar3;
        do {
          bVar2 = iVar26 < SUB164(auVar32 ^ auVar4,0);
          iVar33 = SUB164(auVar32 ^ auVar4,4);
          if ((bool)(~(iVar28 < iVar33 || iVar33 == iVar28 && bVar2) & 1)) {
            *(uint *)(lVar18 + uVar19 * 4) = -(uint)((uVar24 & (uint)uVar19) != 0);
          }
          if (iVar28 >= iVar33 && (iVar33 != iVar28 || !bVar2)) {
            *(uint *)(lVar18 + 4 + uVar19 * 4) = -(uint)(((uint)uVar19 + 1 & uVar24) != 0);
          }
          uVar19 = uVar19 + 2;
          lVar25 = auVar32._8_8_;
          auVar32._0_8_ = auVar32._0_8_ + 2;
          auVar32._8_8_ = lVar25 + 2;
        } while ((uVar16 + 1 & 0xfffffffe) != uVar19);
      }
      uVar21 = uVar21 + 1;
    } while (uVar21 != uVar23);
    if (iVar20 < 1) goto LAB_00731f31;
    iVar20 = pAig->nRegs;
    pVVar13 = pAig->vCis;
    uVar21 = 0;
    do {
      lVar18 = (long)pVVar13->nSize;
      if (lVar18 - iVar20 <= (long)uVar21) {
        __assert_fail("v < Gia_ManPiNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d4,"Gia_Obj_t *Gia_ManPi(Gia_Man_t *, int)");
      }
      if (lVar18 <= (long)uVar21) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar26 = pVVar13->pArray[uVar21];
      if ((iVar26 < 0) || (pAig->nObjs <= iVar26)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      memcpy(__s + (iVar26 << (bVar15 & 0x1f)),(void *)__ptr[uVar21],(long)iVar22 * 4);
      uVar21 = uVar21 + 1;
    } while (uVar23 != uVar21);
  }
  free(__ptr);
LAB_00731f3e:
  memset(__s,0,(long)iVar22 << 2);
  pVVar13 = (Vec_Int_t *)malloc(0x10);
  pVVar13->nCap = 1000;
  pVVar13->nSize = 0;
  piVar14 = (int *)malloc(4000);
  pVVar13->pArray = piVar14;
  pGVar7->vStgDump = pVVar13;
  return pGVar7;
}

Assistant:

Gia_ManEra_t * Gia_ManEraCreate( Gia_Man_t * pAig )
{
    Vec_Ptr_t * vTruths;
    Gia_ManEra_t * p;
    unsigned * pTruth, * pSimInfo;
    int i;
    p = ABC_CALLOC( Gia_ManEra_t, 1 );
    p->pAig      = pAig;
    p->nWordsSim = Abc_TruthWordNum( Gia_ManPiNum(pAig) );
    p->nWordsDat = Abc_BitWordNum( Gia_ManRegNum(pAig) );
    p->pDataSim  = ABC_ALLOC( unsigned, p->nWordsSim*Gia_ManObjNum(pAig) );
    p->pMemory   = Mem_FixedStart( sizeof(Gia_ObjEra_t) + sizeof(unsigned) * p->nWordsDat );
    p->vStates   = Vec_PtrAlloc( 100000 );
    p->nBins     = Abc_PrimeCudd( 100000 );
    p->pBins     = ABC_CALLOC( unsigned, p->nBins );
    Vec_PtrPush( p->vStates, NULL );
    // assign primary input values
    vTruths = Vec_PtrAllocTruthTables( Gia_ManPiNum(pAig) );
    Vec_PtrForEachEntry( unsigned *, vTruths, pTruth, i )
    {
        pSimInfo = Gia_ManEraData( p, Gia_ObjId(pAig, Gia_ManPi(pAig, i)) );
        memcpy( pSimInfo, pTruth, sizeof(unsigned) * p->nWordsSim );
    }
    Vec_PtrFree( vTruths );
    // assign constant zero node
    pSimInfo = Gia_ManEraData( p, 0 );
    memset( pSimInfo, 0, sizeof(unsigned) * p->nWordsSim );
    p->vStgDump = Vec_IntAlloc( 1000 );
    return p;
}